

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O2

string * __thiscall
ser::Serializer::ToString_abi_cxx11_(string *__return_storage_ptr__,Serializer *this)

{
  ostream *poVar1;
  type pFVar2;
  ostringstream ss;
  string sStack_238;
  string local_218;
  string local_1f8;
  string local_1d8 [32];
  string local_1b8 [32];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Serializer\n");
  poVar1 = std::operator<<(poVar1,"Directory: ");
  pFVar2 = boost::shared_ptr<ser::FileFormat>::operator->(&this->pFileFormat_);
  std::__cxx11::string::string(local_1b8,(string *)&pFVar2->directory_);
  poVar1 = std::operator<<(poVar1,local_1b8);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Prefix: ");
  pFVar2 = boost::shared_ptr<ser::FileFormat>::operator->(&this->pFileFormat_);
  std::__cxx11::string::string(local_1d8,(string *)&pFVar2->prefix_);
  poVar1 = std::operator<<(poVar1,local_1d8);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Globalmetainfo: ");
  MetainfoSet::ToString_abi_cxx11_(&local_1f8,&this->globalMetainfo_);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
  poVar1 = std::operator<<(poVar1,"\n");
  FieldsTable::ToString_abi_cxx11_(&local_218,&this->fieldsTable_);
  poVar1 = std::operator<<(poVar1,(string *)&local_218);
  OffsetTable::ToString_abi_cxx11_(&sStack_238,&this->offsetTable_);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_238);
  std::operator<<(poVar1,"----------------------------------------------\n");
  std::__cxx11::string::~string((string *)&sStack_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string Serializer::ToString() const
{
    std::ostringstream ss;
    ss << "Serializer\n"
       << "Directory: " << pFileFormat_->directory() << "\n"
       << "Prefix: " << pFileFormat_->prefix() << "\n"
       << "Globalmetainfo: " << globalMetainfo_.ToString() << "\n"
       << fieldsTable_.ToString()
       << offsetTable_.ToString()
       << "----------------------------------------------\n";
    return ss.str();
}